

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O2

void testDefaultHelp_ClearHelpText_ShouldSucceed(void)

{
  __type _Var1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Argengine ae;
  string answer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0 [32];
  stringstream ss;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"test",(allocator<char> *)&answer);
  __l._M_len = 1;
  __l._M_array = (iterator)&ss;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8,__l,(allocator_type *)&local_1d0);
  juzzlin::Argengine::Argengine(&ae,&local_1e8,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::Argengine::setOutputStream((ostream *)&ae);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"",(allocator<char> *)&answer);
  juzzlin::Argengine::setHelpText(&ae,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  juzzlin::Argengine::printHelp();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&answer,"Options:\n\n-h, --help  Show this help.\n\n",
             (allocator<char> *)&local_1d0);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_1d0,&answer);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&answer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    juzzlin::Argengine::~Argengine(&ae);
    return;
  }
  __assert_fail("ss.str() == answer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                ,0x57,"void testDefaultHelp_ClearHelpText_ShouldSucceed()");
}

Assistant:

void testDefaultHelp_ClearHelpText_ShouldSucceed()
{
    Argengine ae({ "test" });
    std::stringstream ss;
    ae.setOutputStream(ss);
    ae.setHelpText("");
    ae.printHelp();
    const std::string answer = "Options:\n\n"
                               "-h, --help  Show this help.\n\n";
    assert(ss.str() == answer);
}